

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetupViewportDrawData(ImGuiViewportP *viewport,ImVector<ImDrawList_*> *draw_lists)

{
  ImGuiIO *pIVar1;
  ImDrawList **local_38;
  int local_2c;
  int n;
  ImDrawData *draw_data;
  ImGuiIO *io;
  ImVector<ImDrawList_*> *draw_lists_local;
  ImGuiViewportP *viewport_local;
  
  pIVar1 = ImGui::GetIO();
  (viewport->DrawDataP).Valid = true;
  if (draw_lists->Size < 1) {
    local_38 = (ImDrawList **)0x0;
  }
  else {
    local_38 = draw_lists->Data;
  }
  (viewport->DrawDataP).CmdLists = local_38;
  (viewport->DrawDataP).CmdListsCount = draw_lists->Size;
  (viewport->DrawDataP).TotalIdxCount = 0;
  (viewport->DrawDataP).TotalVtxCount = 0;
  (viewport->DrawDataP).DisplayPos = (viewport->super_ImGuiViewport).Pos;
  (viewport->DrawDataP).DisplaySize = (viewport->super_ImGuiViewport).Size;
  (viewport->DrawDataP).FramebufferScale = pIVar1->DisplayFramebufferScale;
  for (local_2c = 0; local_2c < draw_lists->Size; local_2c = local_2c + 1) {
    (viewport->DrawDataP).TotalVtxCount =
         (draw_lists->Data[local_2c]->VtxBuffer).Size + (viewport->DrawDataP).TotalVtxCount;
    (viewport->DrawDataP).TotalIdxCount =
         (draw_lists->Data[local_2c]->IdxBuffer).Size + (viewport->DrawDataP).TotalIdxCount;
  }
  return;
}

Assistant:

static void SetupViewportDrawData(ImGuiViewportP* viewport, ImVector<ImDrawList*>* draw_lists)
{
    ImGuiIO& io = ImGui::GetIO();
    ImDrawData* draw_data = &viewport->DrawDataP;
    draw_data->Valid = true;
    draw_data->CmdLists = (draw_lists->Size > 0) ? draw_lists->Data : NULL;
    draw_data->CmdListsCount = draw_lists->Size;
    draw_data->TotalVtxCount = draw_data->TotalIdxCount = 0;
    draw_data->DisplayPos = viewport->Pos;
    draw_data->DisplaySize = viewport->Size;
    draw_data->FramebufferScale = io.DisplayFramebufferScale;
    for (int n = 0; n < draw_lists->Size; n++)
    {
        draw_data->TotalVtxCount += draw_lists->Data[n]->VtxBuffer.Size;
        draw_data->TotalIdxCount += draw_lists->Data[n]->IdxBuffer.Size;
    }
}